

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int bitset_container_to_uint32_array(uint32_t *out,bitset_container_t *bc,uint32_t base)

{
  uint64_t *puVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  uint64_t uVar7;
  uint32_t *puVar8;
  
  uVar3 = croaring_hardware_support();
  if (((uVar3 & 2) == 0) || ((long)bc->cardinality < 0x2000)) {
    if (((uVar3 & 1) == 0) || ((long)bc->cardinality < 0x2000)) {
      puVar1 = bc->words;
      iVar4 = 0;
      lVar6 = 0;
      do {
        uVar7 = puVar1[lVar6];
        if (uVar7 != 0) {
          puVar8 = out + iVar4;
          do {
            lVar2 = 0;
            if (uVar7 != 0) {
              for (; (uVar7 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
              }
            }
            *puVar8 = (int)lVar2 + base;
            iVar4 = iVar4 + 1;
            puVar8 = puVar8 + 1;
            uVar7 = uVar7 & uVar7 - 1;
          } while (uVar7 != 0);
        }
        base = base + 0x40;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x400);
    }
    else {
      sVar5 = bitset_extract_setbits_avx2(bc->words,0x400,out,(long)bc->cardinality,base);
      iVar4 = (int)sVar5;
    }
  }
  else {
    sVar5 = bitset_extract_setbits_avx512(bc->words,0x400,out,(long)bc->cardinality,base);
    iVar4 = (int)sVar5;
  }
  return iVar4;
}

Assistant:

int bitset_container_to_uint32_array(
    uint32_t *out,
    const bitset_container_t *bc,
    uint32_t base
){
#if CROARING_IS_X64
   int support = croaring_hardware_support();
#if CROARING_COMPILER_SUPPORTS_AVX512
   if(( support & ROARING_SUPPORTS_AVX512 ) &&  (bc->cardinality >= 8192))  // heuristic
		return (int) bitset_extract_setbits_avx512(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, bc->cardinality, base);
   else
#endif
   if(( support & ROARING_SUPPORTS_AVX2 ) &&  (bc->cardinality >= 8192))  // heuristic
		return (int) bitset_extract_setbits_avx2(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, bc->cardinality, base);
	else
		return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#else
	return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#endif
}